

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O3

int ucnv_compareNames_63(char *name1,char *name2)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  
  bVar2 = false;
  bVar1 = false;
  do {
    bVar5 = *name1;
    uVar6 = (ulong)bVar5;
    name1 = (char *)((byte *)name1 + 1);
    if (bVar5 == 0) {
      bVar5 = 0;
    }
    else {
      bVar2 = !bVar2;
      do {
        bVar4 = (byte)uVar6;
        if ((-1 < (char)bVar4) && (bVar5 = ""[uVar6 & 0xff], bVar5 != 0)) {
          if (bVar5 == 1) {
            if (bVar2) {
              uVar7 = (ulong)*name1;
              if ((-1 < (long)uVar7) && (""[uVar7] - 1 < 2)) goto LAB_00336bc5;
              goto LAB_00336bd4;
            }
          }
          else if (bVar5 != 2) {
            bVar2 = false;
            goto LAB_00336bee;
          }
          bVar2 = true;
          bVar5 = bVar4;
          goto LAB_00336bee;
        }
        uVar7 = (ulong)(byte)*name1;
LAB_00336bc5:
        name1 = (char *)((byte *)name1 + 1);
        bVar2 = true;
        uVar6 = uVar7 & 0xffffffff;
      } while ((char)uVar7 != '\0');
      bVar4 = 0;
LAB_00336bd4:
      bVar2 = false;
      bVar5 = bVar4;
    }
LAB_00336bee:
    bVar4 = *name2;
    uVar6 = (ulong)bVar4;
    name2 = (char *)((byte *)name2 + 1);
    iVar3 = 0;
    if (bVar4 == 0) {
      uVar9 = 0;
    }
    else {
      bVar1 = !bVar1;
      do {
        uVar8 = (uint)uVar6;
        if ((-1 < (char)uVar6) && (""[uVar6 & 0xff] != 0)) {
          uVar9 = (uint)""[uVar6 & 0xff];
          if (uVar9 == 1) {
            if (bVar1) {
              uVar7 = (ulong)*name2;
              if ((-1 < (long)uVar7) && (""[uVar7] - 1 < 2)) goto LAB_00336c3d;
              goto LAB_00336c4e;
            }
          }
          else if (uVar9 != 2) {
            bVar1 = false;
            goto LAB_00336c69;
          }
          bVar1 = true;
          uVar9 = uVar8;
          goto LAB_00336c69;
        }
        uVar7 = (ulong)(byte)*name2;
LAB_00336c3d:
        name2 = (char *)((byte *)name2 + 1);
        bVar1 = true;
        uVar6 = uVar7 & 0xffffffff;
      } while ((char)uVar7 != '\0');
      uVar8 = 0;
LAB_00336c4e:
      bVar1 = false;
      uVar9 = uVar8;
    }
LAB_00336c69:
    if (((char)uVar9 == '\0' && bVar5 == 0) || (iVar3 = (uint)bVar5 - (uVar9 & 0xff), iVar3 != 0)) {
      return iVar3;
    }
  } while( true );
}

Assistant:

U_CAPI int U_EXPORT2
ucnv_compareNames(const char *name1, const char *name2) {
    int rc;
    uint8_t type, nextType;
    char c1, c2;
    UBool afterDigit1 = FALSE, afterDigit2 = FALSE;

    for (;;) {
        while ((c1 = *name1++) != 0) {
            type = GET_CHAR_TYPE(c1);
            switch (type) {
            case UIGNORE:
                afterDigit1 = FALSE;
                continue; /* ignore all but letters and digits */
            case ZERO:
                if (!afterDigit1) {
                    nextType = GET_CHAR_TYPE(*name1);
                    if (nextType == ZERO || nextType == NONZERO) {
                        continue; /* ignore leading zero before another digit */
                    }
                }
                break;
            case NONZERO:
                afterDigit1 = TRUE;
                break;
            default:
                c1 = (char)type; /* lowercased letter */
                afterDigit1 = FALSE;
                break;
            }
            break; /* deliver c1 */
        }
        while ((c2 = *name2++) != 0) {
            type = GET_CHAR_TYPE(c2);
            switch (type) {
            case UIGNORE:
                afterDigit2 = FALSE;
                continue; /* ignore all but letters and digits */
            case ZERO:
                if (!afterDigit2) {
                    nextType = GET_CHAR_TYPE(*name2);
                    if (nextType == ZERO || nextType == NONZERO) {
                        continue; /* ignore leading zero before another digit */
                    }
                }
                break;
            case NONZERO:
                afterDigit2 = TRUE;
                break;
            default:
                c2 = (char)type; /* lowercased letter */
                afterDigit2 = FALSE;
                break;
            }
            break; /* deliver c2 */
        }

        /* If we reach the ends of both strings then they match */
        if ((c1|c2)==0) {
            return 0;
        }

        /* Case-insensitive comparison */
        rc = (int)(unsigned char)c1 - (int)(unsigned char)c2;
        if (rc != 0) {
            return rc;
        }
    }
}